

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O3

EVP_PKEY_CTX * EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  EVP_PKEY_CTX *ctx_00;
  
  if (((*(long *)ctx != 0) && (*(long *)(*(long *)ctx + 0x10) != 0)) &&
     (ctx_00 = (EVP_PKEY_CTX *)OPENSSL_zalloc(0x30), ctx_00 != (EVP_PKEY_CTX *)0x0)) {
    uVar1 = *(undefined8 *)(ctx + 8);
    *(undefined8 *)ctx_00 = *(undefined8 *)ctx;
    *(undefined8 *)(ctx_00 + 8) = uVar1;
    *(undefined4 *)(ctx_00 + 0x20) = *(undefined4 *)(ctx + 0x20);
    if (*(EVP_PKEY **)(ctx + 0x10) != (EVP_PKEY *)0x0) {
      EVP_PKEY_up_ref(*(EVP_PKEY **)(ctx + 0x10));
      *(undefined8 *)(ctx_00 + 0x10) = *(undefined8 *)(ctx + 0x10);
    }
    if (*(EVP_PKEY **)(ctx + 0x18) != (EVP_PKEY *)0x0) {
      EVP_PKEY_up_ref(*(EVP_PKEY **)(ctx + 0x18));
      *(undefined8 *)(ctx_00 + 0x18) = *(undefined8 *)(ctx + 0x18);
    }
    iVar2 = (**(code **)(*(long *)ctx + 0x10))(ctx_00);
    if (0 < iVar2) {
      return ctx_00;
    }
    *(undefined8 *)ctx_00 = 0;
    ERR_put_error(6,0,6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                  ,0x88);
    EVP_PKEY_CTX_free(ctx_00);
  }
  return (EVP_PKEY_CTX *)0x0;
}

Assistant:

EVP_PKEY_CTX *EVP_PKEY_CTX_dup(EVP_PKEY_CTX *ctx) {
  if (!ctx->pmeth || !ctx->pmeth->copy) {
    return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY_CTX> ret(
      reinterpret_cast<EVP_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EVP_PKEY_CTX))));
  if (!ret) {
    return nullptr;
  }

  ret->pmeth = ctx->pmeth;
  ret->engine = ctx->engine;
  ret->operation = ctx->operation;

  if (ctx->pkey != nullptr) {
    EVP_PKEY_up_ref(ctx->pkey);
    ret->pkey = ctx->pkey;
  }

  if (ctx->peerkey != nullptr) {
    EVP_PKEY_up_ref(ctx->peerkey);
    ret->peerkey = ctx->peerkey;
  }

  if (ctx->pmeth->copy(ret.get(), ctx) <= 0) {
    ret->pmeth = nullptr;
    OPENSSL_PUT_ERROR(EVP, ERR_LIB_EVP);
    return nullptr;
  }

  return ret.release();
}